

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O2

UBool icu_63::UnicodeSet::resemblesPropertyPattern(UnicodeString *pattern,int32_t pos)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  UBool UVar4;
  
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (pattern->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 < pos + 5) {
    UVar4 = '\0';
  }
  else {
    UVar2 = anon_unknown_0::isPOSIXOpen(pattern,pos);
    UVar4 = '\x01';
    if (UVar2 == '\0') {
      UVar2 = anon_unknown_0::isPerlOpen(pattern,pos);
      if (UVar2 == '\0') {
        UVar2 = anon_unknown_0::isNameOpen(pattern,pos);
        return UVar2;
      }
    }
  }
  return UVar4;
}

Assistant:

UBool UnicodeSet::resemblesPropertyPattern(const UnicodeString& pattern,
                                           int32_t pos) {
    // Patterns are at least 5 characters long
    if ((pos+5) > pattern.length()) {
        return FALSE;
    }

    // Look for an opening [:, [:^, \p, or \P
    return isPOSIXOpen(pattern, pos) || isPerlOpen(pattern, pos) || isNameOpen(pattern, pos);
}